

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O0

int tlsio_openssl_open(CONCRETE_IO_HANDLE tls_io,ON_IO_OPEN_COMPLETE on_io_open_complete,
                      void *on_io_open_complete_context,ON_BYTES_RECEIVED on_bytes_received,
                      void *on_bytes_received_context,ON_IO_ERROR on_io_error,
                      void *on_io_error_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  TLS_IO_INSTANCE *tls_io_instance;
  LOGGER_LOG l;
  int result;
  ON_IO_ERROR on_io_error_local;
  void *on_bytes_received_context_local;
  ON_BYTES_RECEIVED on_bytes_received_local;
  void *on_io_open_complete_context_local;
  ON_IO_OPEN_COMPLETE on_io_open_complete_local;
  CONCRETE_IO_HANDLE tls_io_local;
  
  if (tls_io == (CONCRETE_IO_HANDLE)0x0) {
    l._4_4_ = 0x58e;
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/tlsio_openssl.c"
                ,"tlsio_openssl_open",0x58f,1,"NULL tls_io.");
    }
  }
  else if (*(int *)((long)tls_io + 0x68) == 0) {
    *(ON_IO_OPEN_COMPLETE *)((long)tls_io + 0x10) = on_io_open_complete;
    *(void **)((long)tls_io + 0x30) = on_io_open_complete_context;
    *(ON_BYTES_RECEIVED *)((long)tls_io + 8) = on_bytes_received;
    *(void **)((long)tls_io + 0x28) = on_bytes_received_context;
    *(ON_IO_ERROR *)((long)tls_io + 0x20) = on_io_error;
    *(void **)((long)tls_io + 0x40) = on_io_error_context;
    *(undefined4 *)((long)tls_io + 0x68) = 1;
    iVar1 = create_openssl_instance((TLS_IO_INSTANCE *)tls_io);
    if (iVar1 == 0) {
      iVar1 = xio_open(*tls_io,on_underlying_io_open_complete,tls_io,on_underlying_io_bytes_received
                       ,tls_io,on_underlying_io_error,tls_io);
      if (iVar1 == 0) {
        l._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/tlsio_openssl.c"
                    ,"tlsio_openssl_open",0x5b0,1,"Failed opening the underlying I/O.");
        }
        close_openssl_instance((TLS_IO_INSTANCE *)tls_io);
        *(undefined4 *)((long)tls_io + 0x68) = 0;
        l._4_4_ = 0x5b3;
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/tlsio_openssl.c"
                  ,"tlsio_openssl_open",0x5a9,1,"Failed creating the OpenSSL instance.");
      }
      *(undefined4 *)((long)tls_io + 0x68) = 0;
      l._4_4_ = 0x5ab;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/adapters/tlsio_openssl.c"
                ,"tlsio_openssl_open",0x597,1,
                "Invalid tlsio_state. Expected state is TLSIO_STATE_NOT_OPEN.");
    }
    l._4_4_ = 0x598;
  }
  return l._4_4_;
}

Assistant:

int tlsio_openssl_open(CONCRETE_IO_HANDLE tls_io, ON_IO_OPEN_COMPLETE on_io_open_complete, void* on_io_open_complete_context, ON_BYTES_RECEIVED on_bytes_received, void* on_bytes_received_context, ON_IO_ERROR on_io_error, void* on_io_error_context)
{
    int result;

    if (tls_io == NULL)
    {
        result = MU_FAILURE;
        LogError("NULL tls_io.");
    }
    else
    {
        TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)tls_io;

        if (tls_io_instance->tlsio_state != TLSIO_STATE_NOT_OPEN)
        {
            LogError("Invalid tlsio_state. Expected state is TLSIO_STATE_NOT_OPEN.");
            result = MU_FAILURE;
        }
        else
        {
            tls_io_instance->on_io_open_complete = on_io_open_complete;
            tls_io_instance->on_io_open_complete_context = on_io_open_complete_context;

            tls_io_instance->on_bytes_received = on_bytes_received;
            tls_io_instance->on_bytes_received_context = on_bytes_received_context;

            tls_io_instance->on_io_error = on_io_error;
            tls_io_instance->on_io_error_context = on_io_error_context;

            tls_io_instance->tlsio_state = TLSIO_STATE_OPENING_UNDERLYING_IO;

            if (create_openssl_instance(tls_io_instance) != 0)
            {
                LogError("Failed creating the OpenSSL instance.");
                tls_io_instance->tlsio_state = TLSIO_STATE_NOT_OPEN;
                result = MU_FAILURE;
            }
            else if (xio_open(tls_io_instance->underlying_io, on_underlying_io_open_complete, tls_io_instance,
                on_underlying_io_bytes_received, tls_io_instance, on_underlying_io_error, tls_io_instance) != 0)
            {
                LogError("Failed opening the underlying I/O.");
                close_openssl_instance(tls_io_instance);
                tls_io_instance->tlsio_state = TLSIO_STATE_NOT_OPEN;
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
    }

    return result;
}